

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

monst * makemon(permonst *ptr,level *lev,int x,int y,int mmflags)

{
  byte *pbVar1;
  d_level *pdVar2;
  level *lev_00;
  boolean bVar3;
  byte bVar4;
  char cVar5;
  xchar xVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  monst *pmVar15;
  char *pcVar16;
  permonst *ppVar17;
  obj *poVar18;
  int iVar19;
  ulong uVar20;
  int tmp_2;
  uint uVar21;
  int tmp;
  int iVar22;
  bool bVar23;
  bool bVar24;
  coord bypos;
  permonst *local_e8;
  monst local_a8;
  
  uVar20 = (ulong)(uint)x;
  iVar9 = (int)u.ux;
  bVar24 = u.uy == y;
  uVar21 = mmflags & 0x80;
  if (y == 0 && x == 0) {
    pmVar15 = &local_a8;
    if (ptr == (permonst *)0x0) {
      pmVar15 = (monst *)0x0;
    }
    uVar14 = 0;
    local_a8.data = ptr;
    while( true ) {
      uVar12 = mt_random();
      uVar20 = (ulong)(uVar12 % 0x4d) + 2;
      uVar12 = mt_random();
      y = uVar12 % 0x15;
      bVar3 = goodpos(lev,(int)uVar20,y,pmVar15,uVar21);
      if ((bVar3 != '\0' || 99 < uVar14) &&
         (((in_mklev != '\0' || (0x31 < uVar14)) || ((viz_array[(uint)y][uVar20] & 2U) == 0))))
      break;
      uVar14 = uVar14 + 1;
    }
    bVar23 = uVar14 < 99;
  }
  else {
    bVar23 = true;
    if (in_mklev == '\0' && (bVar24 && iVar9 == x)) {
      bVar3 = enexto_core((coord *)&local_a8,lev,u.ux,u.uy,ptr,uVar21);
      if (bVar3 == '\0') {
        return (monst *)0x0;
      }
      uVar20 = (ulong)(uint)(int)(char)local_a8.nmon;
      y = (int)local_a8.nmon._1_1_;
    }
  }
  iVar19 = (int)uVar20;
  pmVar15 = lev->monsters[iVar19][y];
  if (((pmVar15 != (monst *)0x0) && ((pmVar15->field_0x61 & 2) == 0)) || (!bVar23)) {
    if (((uint)mmflags >> 8 & 1) == 0) {
      return (monst *)0x0;
    }
    bVar3 = enexto_core((coord *)&local_a8,lev,(xchar)uVar20,(xchar)y,ptr,uVar21);
    if (bVar3 == '\0') {
      return (monst *)0x0;
    }
    iVar19 = (int)(char)local_a8.nmon;
    y = (int)local_a8.nmon._1_1_;
  }
  if (ptr == (permonst *)0x0) {
    uVar14 = 0;
    do {
      local_e8 = rndmonst(lev);
      if (local_e8 == (permonst *)0x0) {
        return (monst *)0x0;
      }
      local_a8.data = local_e8;
      bVar3 = goodpos(lev,iVar19,y,&local_a8,uVar21);
    } while ((bVar3 == '\0') && (bVar23 = uVar14 < 0x32, uVar14 = uVar14 + 1, bVar23));
    iVar10 = monsndx(local_e8);
  }
  else {
    iVar10 = monsndx(ptr);
    local_e8 = ptr;
    if ((mvitals[iVar10].mvflags & 2) != 0) {
      return (monst *)0x0;
    }
  }
  sVar7 = quest_info(0x1f);
  if (iVar10 == sVar7) {
    local_e8 = &pm_leader;
  }
  else {
    sVar7 = quest_info(0x21);
    if (iVar10 == sVar7) {
      local_e8 = &pm_guardian;
    }
    else {
      sVar7 = quest_info(0x20);
      if (iVar10 == sVar7) {
        local_e8 = &pm_nemesis;
      }
    }
  }
  propagate(iVar10,(mmflags & 0x40U) == 0,'\0');
  iVar11 = 3;
  if ((mmflags & 4U) == 0) {
    iVar11 = 2;
    if ((mmflags & 8U) == 0) {
      iVar11 = (int)local_e8->pxtyp;
    }
  }
  pmVar15 = newmonst(iVar11,0);
  pmVar15->nmon = lev->monlist;
  lev->monlist = pmVar15;
  uVar14 = flags.ident;
  uVar21 = flags.ident + 1;
  uVar12 = uVar21;
  pmVar15->m_id = flags.ident;
  flags.ident = uVar12;
  if (uVar14 == 0) {
    flags.ident = 2;
    pmVar15->m_id = uVar21;
  }
  set_mon_data(pmVar15,local_e8,0);
  if (pmVar15->data->msound == '\x1f') {
    quest_status.leader_m_id = pmVar15->m_id;
  }
  pmVar15->mnum = (short)iVar10;
  pdVar2 = &lev->z;
  uVar21 = adj_lev(pdVar2,local_e8);
  pmVar15->m_lev = (uchar)uVar21;
  if (local_e8->mlet == '7') {
    iVar11 = golemhp(iVar10);
    pmVar15->mhp = iVar11;
    pmVar15->mhpmax = iVar11;
  }
  else if (local_e8 == mons + 0x145 || (local_e8 == mons + 0x146 || local_e8 == mons + 0x144)) {
    iVar22 = 8;
    iVar11 = -8;
    do {
      uVar21 = mt_random();
      iVar22 = iVar22 + (uVar21 & 7);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0);
    pmVar15->mhp = iVar22 + 100;
    pmVar15->mhpmax = iVar22 + 100;
  }
  else if (local_e8->mlevel < '2') {
    if ((iVar10 < 0x93 || local_e8->mlet != '\x1e') ||
       (pdVar2->dnum != dungeon_topology.d_astral_level.dnum)) {
      if ((uchar)uVar21 == '\0') {
        uVar21 = mt_random();
        iVar11 = (uVar21 & 3) + 1;
      }
      else {
        if (local_e8->msound != '\x1f') {
          uVar20 = (ulong)pmVar15->data->msize;
          uVar14 = 8;
          if (uVar20 < 8) {
            uVar14 = *(uint *)(&DAT_002b2d3c + uVar20 * 4);
          }
          uVar21 = uVar21 & 0xff;
          uVar12 = uVar21;
          do {
            uVar13 = mt_random();
            uVar21 = uVar21 + uVar13 % uVar14;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
          pmVar15->mhp = uVar21;
          pmVar15->mhpmax = uVar21;
          bVar3 = is_home_elemental(pdVar2,local_e8);
          if (bVar3 != '\0') {
            iVar11 = pmVar15->mhp * 3;
            pmVar15->mhp = iVar11;
            pmVar15->mhpmax = iVar11;
          }
          goto LAB_001bc70f;
        }
        uVar21 = mt_random();
        iVar11 = uVar21 + uVar21 / 0x1e + uVar21 / 0x1e + (uVar21 / 0x1e) * -0x20 + 0x88;
      }
      pmVar15->mhp = iVar11;
      pmVar15->mhpmax = iVar11;
    }
    else {
      uVar21 = uVar21 & 0xff;
      iVar11 = uVar21 * 7;
      uVar14 = uVar21;
      if (uVar21 == 0) {
        uVar21 = 0;
      }
      else {
        do {
          uVar12 = mt_random();
          uVar21 = uVar21 + (uVar12 & 7);
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar11 = uVar21 + iVar11;
      pmVar15->mhp = iVar11;
      pmVar15->mhpmax = iVar11;
    }
  }
  else {
    iVar11 = (uint)(byte)local_e8->mlevel * 2 + -0xc;
    pmVar15->mhp = iVar11;
    pmVar15->mhpmax = iVar11;
    pmVar15->m_lev = (byte)iVar11 >> 2;
  }
LAB_001bc70f:
  if ((local_e8->mflags2 >> 0x11 & 1) == 0) {
    if ((local_e8->mflags2 >> 0x10 & 1) == 0) {
      uVar21 = mt_random();
      *(uint *)&pmVar15->field_0x60 = *(uint *)&pmVar15->field_0x60 & 0xfffffffe | uVar21 & 1;
    }
    else {
      pmVar15->field_0x60 = pmVar15->field_0x60 & 0xfe;
    }
  }
  else {
    pmVar15->field_0x60 = pmVar15->field_0x60 | 1;
  }
  if ((pdVar2->dnum == dungeon_topology.d_sokoban_dnum) && ((local_e8->mflags1 & 0x10000) == 0)) {
    pmVar15->mtrapseen = 0x1400;
  }
  if (local_e8->msound == '\x1f') {
    pbVar1 = (byte *)((long)&pmVar15->mtrapseen + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  pmVar15->dlevel = lev;
  place_monster(pmVar15,iVar19,y);
  uVar21 = *(uint *)&pmVar15->field_0x60 | 0x60000;
  *(uint *)&pmVar15->field_0x60 = uVar21;
  uVar14 = 0;
  if ((mmflags & 0x10U) == 0) {
    bVar4 = peace_minded(local_e8);
    uVar14 = (uint)bVar4 << 0x16;
    uVar21 = *(uint *)&pmVar15->field_0x60;
  }
  uVar12 = uVar21 & 0xffbfffff | uVar14;
  *(uint *)&pmVar15->field_0x60 = uVar12;
  switch(local_e8->mlet) {
  case '\f':
switchD_001bc813_caseD_c:
    uVar12 = uVar12 | 0x80000;
LAB_001bc9fc:
    *(uint *)&pmVar15->field_0x60 = uVar12;
    break;
  case '\r':
    set_mimic_sym(pmVar15,lev);
    break;
  case '\x0e':
    if ((u.uhave._0_1_ & 1) == 0) goto switchD_001bc813_caseD_c;
    break;
  case '\x0f':
    if (urace.malenum == 0x111) {
      uVar12 = uVar21 & 0xffbfffff | uVar14 & 0xffbfffff;
      goto LAB_001bc9fc;
    }
    break;
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x14':
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x1a':
  case '\x1b':
  case '\x1d':
  case '\x1e':
  case ' ':
  case '!':
  case '\"':
  case '#':
    break;
  case '\x13':
switchD_001bc813_caseD_13:
    if (((in_mklev != '\0') && (iVar19 != 0)) && (y != 0)) {
      mkobj_at('\0',lev,iVar19,y,'\x01');
    }
    if (((local_e8->mflags1 & 0x80) != 0) && (lev->objects[iVar19][y] != (obj *)0x0)) {
      pmVar15->field_0x60 = pmVar15->field_0x60 | 0x80;
    }
    break;
  case '\x15':
    if ((local_e8->mflags2 & 0x20000000) != 0) {
      iVar11 = sgn((int)u.ualign.type);
      iVar22 = sgn((int)local_e8->maligntyp);
      if (iVar11 == iVar22) {
        pmVar15->field_0x62 = pmVar15->field_0x62 | 0x40;
      }
    }
    break;
  case '\x19':
  case '\x1f':
    if ((iVar10 == 0x9e) || (iVar10 == 0x7b)) {
      uVar12 = uVar12 | 10;
      goto LAB_001bc9fc;
    }
    break;
  case '\x1c':
    bVar3 = In_hell(pdVar2);
    if ((bVar3 != '\0') &&
       (local_e8 == mons + 0x85 || (local_e8 == mons + 0x83 || local_e8 == mons + 0x82))) {
      mon_adjust_speed(pmVar15,2,(obj *)0x0);
    }
    break;
  case '$':
    uVar21 = mt_random();
    if ((0x33333333 < uVar21 * -0x33333333) && ((u.uhave._0_1_ & 1) == 0)) {
      pmVar15->field_0x62 = pmVar15->field_0x62 | 8;
    }
    break;
  default:
    if (local_e8->mlet == '-') goto switchD_001bc813_caseD_13;
  }
  ppVar17 = pmVar15->data;
  if ((ppVar17 == mons + 0x101 || (ppVar17 == mons + 0x21 || ppVar17 == mons + 0x20)) ||
      ppVar17->mlet == '\x19') {
LAB_001bcaa1:
    new_light_source(lev,pmVar15->mx,pmVar15->my,1,1,pmVar15);
  }
  else {
    pcVar16 = mons_mname(ppVar17);
    iVar11 = strcmp(pcVar16,"gold dragon");
    if (iVar11 == 0) goto LAB_001bcaa1;
    pcVar16 = mons_mname(pmVar15->data);
    iVar11 = strcmp(pcVar16,"baby gold dragon");
    if ((iVar11 == 0) || (pmVar15->data == mons + 0x73 || pmVar15->data == mons + 0xa0))
    goto LAB_001bcaa1;
  }
  uVar21 = pm_to_cham(iVar10);
  if (uVar21 == 0) {
    if (iVar10 == 0x147) {
      flags.djinni_count = flags.djinni_count + 1;
      goto LAB_001bcbd6;
    }
    if (iVar10 == 0x12a) {
      flags.ghost_count = flags.ghost_count + 1;
      if ((mmflags & 0x20U) == 0) {
        pcVar16 = rndghostname();
        pmVar15 = christen_monst(pmVar15,pcVar16);
      }
      goto LAB_001bcbd6;
    }
    if (iVar10 != 0x128) goto LAB_001bcbd6;
    pmVar15->field_0x63 = pmVar15->field_0x63 | 0x20;
    uVar21 = flags.no_of_wizards + 1;
    bVar23 = flags.no_of_wizards != 0;
    flags.no_of_wizards = uVar21;
    if (bVar23) goto LAB_001bcbd6;
    bVar3 = on_level(pdVar2,&dungeon_topology.d_earth_level);
    bVar23 = (mmflags & 1U) == 0;
    if ((bVar23) && (bVar3 != '\0')) {
      mongets(pmVar15,0x17d);
      bVar23 = true;
    }
  }
  else {
    if (u.uprops[0x17].extrinsic == 0 && u.uprops[0x17].intrinsic == 0) {
      *(uint *)&pmVar15->field_0x60 = *(uint *)&pmVar15->field_0x60 & 0xffffff8f | (uVar21 & 7) << 4
      ;
      ppVar17 = rndmonst(lev);
      newcham(lev,pmVar15,ppVar17,'\0','\0');
    }
    else {
      *(uint *)&pmVar15->field_0x60 = *(uint *)&pmVar15->field_0x60 & 0xffffff8f;
    }
LAB_001bcbd6:
    bVar23 = (mmflags & 1U) == 0;
  }
  if (in_mklev == '\0') {
    if (bVar24 && iVar9 == x) {
      newsym((int)pmVar15->mx,(int)pmVar15->my);
      set_apparxy(lev,pmVar15);
    }
  }
  else if ((local_e8->mflags2 >> 9 & 1) == 0) {
    if (((iVar10 == 0x56) || (iVar10 == 0x76)) || (iVar10 == 0x14c)) {
LAB_001bcc59:
      if (((u.uhave._0_1_ & 1) == 0) && (uVar21 = mt_random(), 0x33333333 < uVar21 * -0x33333333)) {
        pmVar15->field_0x62 = pmVar15->field_0x62 | 8;
      }
    }
  }
  else if (((iVar10 == 0x56 || (local_e8->mflags2 & 0x1800) == 0) || (iVar10 == 0x14c)) ||
          (iVar10 == 0x76)) goto LAB_001bcc59;
  if (((~local_e8->mflags2 & 0x1200) == 0) && (local_e8->msound == '\x1c')) {
    uVar21 = *(uint *)&pmVar15->field_0x60 & 0xffbf7ff5;
    *(uint *)&pmVar15->field_0x60 = uVar21 + 0x40000a;
    if ((uwep != (obj *)0x0) && (uwep->oartifact == '\x01')) {
      pmVar15->mtame = '\0';
      *(uint *)&pmVar15->field_0x60 = uVar21 | 10;
    }
  }
  if (iVar10 == 0x76) {
    iVar9 = get_wormno(lev);
    pmVar15->wormno = (uchar)iVar9;
    if ((uchar)iVar9 != '\0') {
      uVar21 = mt_random();
      initworm(pmVar15,uVar21 % 5);
      iVar9 = count_wsegs(pmVar15);
      if (iVar9 != 0) {
        place_worm_tail_randomly(pmVar15,(xchar)iVar19,(xchar)y);
      }
    }
  }
  set_malign(pmVar15);
  if (ptr == (permonst *)0x0) {
    uVar8 = local_e8->geno;
    if ((char)uVar8 < '\0') {
      uVar21 = mt_random();
      if ((uVar21 & 1) == 0) {
        uVar8 = local_e8->geno;
        goto LAB_001bcd4c;
      }
      iVar19 = (int)pmVar15->mx;
      iVar9 = (int)pmVar15->my;
LAB_001bcd84:
      iVar10 = 3;
    }
    else {
LAB_001bcd4c:
      if ((uVar8 & 0x40) == 0) goto LAB_001bcd99;
      uVar21 = mt_random();
      iVar19 = (int)pmVar15->mx;
      iVar9 = (int)pmVar15->my;
      if (uVar21 * -0x55555555 < 0x55555556) goto LAB_001bcd84;
      iVar10 = 10;
    }
    m_initgrp(pmVar15,lev,iVar19,iVar9,iVar10);
  }
LAB_001bcd99:
  if (!bVar23) {
    if (pmVar15->minvent != (obj *)0x0) {
      discard_minvent(pmVar15);
    }
    pmVar15->minvent = (obj *)0x0;
    goto LAB_001bda93;
  }
  bVar3 = attacktype(local_e8,0xfe);
  if (bVar3 == '\0') goto LAB_001bda4f;
  ppVar17 = pmVar15->data;
  iVar9 = monsndx(ppVar17);
  bVar3 = on_level(pdVar2,&dungeon_topology.d_rogue_level);
  if (bVar3 != '\0') goto LAB_001bda4f;
  bVar4 = ppVar17->mlet;
  if (bVar4 < 0x25) {
    if (0x1a < bVar4) {
      if (bVar4 == 0x1b) {
        poVar18 = mksobj(lev,0x26,'\0','\0');
        uVar21 = mt_random();
        if (((uVar21 * -0x33333333 >> 2 | uVar21 * 0x40000000) < 0xccccccd) ||
           ((ppVar17->mflags2 & 0x800) != 0)) {
          uVar21 = mt_random();
          pcVar16 = artiname((uint)((uVar21 & 1) == 0) * 8 + 0xe);
          poVar18 = oname(poVar18,pcVar16);
          if (poVar18->oartifact == '\0') {
            create_oprop(lev,poVar18,'\0');
          }
        }
        bless(poVar18);
        poVar18->field_0x4b = poVar18->field_0x4b | 0x10;
        uVar21 = mt_random();
        cVar5 = (char)(uVar21 & 3);
        if ((int)(uVar21 & 3) < (int)poVar18->spe) {
          cVar5 = poVar18->spe;
        }
        poVar18->spe = cVar5;
        mpickobj(pmVar15,poVar18);
        uVar21 = mt_random();
        if ((uVar21 & 3) == 0) {
          iVar9 = 0x8e;
        }
        else {
          iVar9 = (uint)((*(byte *)((long)&ppVar17->mflags2 + 1) & 8) >> 3) * 2 + 0x8c;
        }
        poVar18 = mksobj(lev,iVar9,'\0','\0');
        *(uint *)&poVar18->field_0x4a = *(uint *)&poVar18->field_0x4a & 0xffffeffe | 0x1000;
        poVar18->spe = '\0';
LAB_001bd53d:
        mpickobj(pmVar15,poVar18);
        goto switchD_001bce42_caseD_4e;
      }
      if (bVar4 != 0x1d) {
        if (bVar4 != 0x22) goto switchD_001bcf9f_caseD_2f;
        uVar21 = mt_random();
        if ((uVar21 & 1) != 0) {
          bVar24 = iVar9 == 0xb4;
          uVar14 = 0x3c;
          uVar21 = 0x214;
LAB_001bd09f:
          if (bVar24) {
            uVar21 = uVar14;
          }
          goto LAB_001bda18;
        }
        goto switchD_001bce42_caseD_4e;
      }
      uVar21 = mt_random();
      if ((uVar21 & 1) == 0) goto switchD_001bce42_caseD_4e;
      if (ppVar17 != mons + 0x87) goto LAB_001bd69e;
switchD_001bd626_caseD_2:
      mongets(pmVar15,0x42);
      iVar19 = 1;
      goto LAB_001bd6b3;
    }
    if (bVar4 == 8) {
      if (iVar9 == 0x2c) {
        uVar21 = mt_random();
        mongets(pmVar15,*(int *)(&DAT_002b27f8 + (ulong)(uVar21 % 3) * 4));
        uVar21 = mt_random();
        if ((uVar21 * -0x33333333 >> 1 | (uint)((uVar21 * -0x33333333 & 1) != 0) << 0x1f) <
            0x1999999a) {
          mongets(pmVar15,0x70);
        }
        uVar21 = mt_random();
        if ((uVar21 * -0x33333333 >> 1 | (uint)((uVar21 * -0x33333333 & 1) != 0) << 0x1f) <
            0x1999999a) {
          uVar21 = 0x7f;
          goto LAB_001bda18;
        }
      }
      else if ((ppVar17->mflags2 & 0x20) != 0) {
        uVar21 = mt_random();
        if (0x24924924 < uVar21 * -0x49249249) {
          mongets(pmVar15,0x7f);
        }
        uVar21 = mt_random();
        if (0x24924924 < uVar21 * -0x49249249) {
          mongets(pmVar15,0x94);
        }
        uVar21 = mt_random();
        if ((uVar21 & 3) != 0) {
          uVar14 = mt_random();
          uVar12 = 0x108;
          uVar21 = 0x11;
          goto LAB_001bd4b8;
        }
        mongets(pmVar15,0x20);
        uVar21 = mt_random();
        iVar9 = 0x33;
        if ((uVar21 & 1) == 0) {
          mongets(pmVar15,0x1b);
          iVar9 = 0x8d;
        }
        mongets(pmVar15,iVar9);
        mongets(pmVar15,0x4a);
        uVar21 = mt_random();
        if (uVar21 * -0x55555555 < 0x55555556) {
          uVar21 = 0x6f;
          goto LAB_001bda18;
        }
      }
      goto switchD_001bce42_caseD_4e;
    }
    if (bVar4 == 0xb) {
      uVar21 = mt_random();
      if ((uVar21 & 3) != 0) goto switchD_001bce42_caseD_4e;
      goto LAB_001bd630;
    }
    if (bVar4 != 0xf) goto switchD_001bcf9f_caseD_2f;
    uVar21 = mt_random();
    if ((uVar21 & 1) != 0) {
      mongets(pmVar15,0x49);
    }
    switch(iVar9) {
    case 0x4c:
      goto switchD_001bce42_caseD_4c;
    case 0x4d:
switchD_001bce42_caseD_4d:
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        mongets(pmVar15,0x7e);
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        mongets(pmVar15,0x1f);
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        mongets(pmVar15,0x94);
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        mongets(pmVar15,0x44);
        m_initthrow(pmVar15,3,0xc);
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        uVar21 = 0x8a;
        goto LAB_001bda18;
      }
      break;
    case 0x4e:
      break;
    case 0x4f:
      uVar21 = mt_random();
      if ((uVar21 & 1) == 0) goto switchD_001bce42_caseD_4d;
switchD_001bce42_caseD_4c:
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        mongets(pmVar15,0x22);
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        mongets(pmVar15,0x8b);
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        mongets(pmVar15,0x17);
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        uVar21 = 0x72;
        goto LAB_001bda18;
      }
      break;
    default:
      uVar21 = mt_random();
      if ((uVar21 & 1) != 0) {
        uVar21 = 0x13;
        if (iVar9 != 0x48) {
          uVar21 = mt_random();
          bVar24 = (uVar21 & 1) == 0;
          uVar14 = 0x13;
          uVar21 = 0x22;
          goto LAB_001bd09f;
        }
        goto LAB_001bda18;
      }
    }
    goto switchD_001bce42_caseD_4e;
  }
  switch(bVar4) {
  case 0x2e:
    uVar21 = mt_random();
    if ((uVar21 & 1) == 0) {
      uVar21 = mt_random();
      switch(uVar21 & 3) {
      case 0:
        uVar21 = 0x2c;
        break;
      case 1:
        uVar21 = 0x2b;
        break;
      case 2:
        uVar21 = 0x2e;
        break;
      case 3:
        uVar21 = 0x2d;
      }
      goto LAB_001bda18;
    }
    break;
  case 0x2f:
  case 0x30:
  case 0x32:
  case 0x33:
  case 0x36:
  case 0x37:
  case 0x39:
switchD_001bcf9f_caseD_2f:
    uVar21 = ppVar17->mflags2;
LAB_001bd5f2:
    uVar14 = mt_random();
    switch((ulong)uVar14 %
           (ulong)(((uVar21 >> 0xb & 3) + (uint)((uVar21 >> 0x19 & 1) != 0)) * 2 ^ 0xe)) {
    case 0:
      if ((ppVar17->mflags2 & 0x4000000) != 0) goto LAB_001bd651;
LAB_001bd630:
      iVar19 = 7;
LAB_001bd6b3:
      iVar9 = 0xc;
LAB_001bd6b8:
      m_initthrow(pmVar15,iVar19,iVar9);
      break;
    case 1:
      if ((ppVar17->mflags2 & 0x4000000) == 0) {
LAB_001bd69e:
        mongets(pmVar15,0x47);
        iVar19 = 6;
        goto LAB_001bd6b3;
      }
      uVar21 = 0x27;
      goto LAB_001bda18;
    case 2:
      goto switchD_001bd626_caseD_2;
    case 3:
      if ((ppVar17->mflags2 & 0x4000000) == 0) {
        iVar19 = 0x11;
        iVar9 = 3;
        goto LAB_001bd6b8;
      }
      goto LAB_001bd2ce;
    case 4:
      if ((ppVar17->mflags2 & 0x4000000) == 0) {
        uVar21 = 0x3f;
      }
      else {
        uVar21 = 0x37;
      }
LAB_001bda18:
      mongets(pmVar15,uVar21);
    }
    break;
  case 0x31:
    mongets(pmVar15,0x17);
LAB_001bd2ce:
    uVar21 = 0x26;
    goto LAB_001bda18;
  case 0x34:
    uVar21 = mt_random();
    if ((uVar21 & 3) == 0) {
      mongets(pmVar15,0x77);
    }
    uVar21 = mt_random();
    if ((uVar21 & 3) == 0) {
      uVar14 = mt_random();
      uVar12 = 0x1d;
      uVar21 = 0x17;
LAB_001bd4b8:
      if (uVar14 * -0x55555555 < 0x55555556) {
        uVar21 = uVar12;
      }
      goto LAB_001bda18;
    }
    break;
  case 0x35:
    if ((ppVar17->mflags2 >> 10 & 1) == 0) {
      if ((ppVar17->mflags2 & 0x10) != 0) {
        uVar21 = mt_random();
        if ((uVar21 & 1) != 0) {
          uVar21 = mt_random();
          iVar19 = 0x70;
          if ((uVar21 & 1) == 0) {
            iVar19 = 0x7d;
          }
          mongets(pmVar15,iVar19);
        }
        uVar21 = mt_random();
        iVar19 = 0x48;
        if ((uVar21 & 1) == 0) {
          uVar21 = mt_random();
          if ((uVar21 & 3) == 0) {
            iVar19 = 0x99;
            goto LAB_001bd734;
          }
        }
        else {
LAB_001bd734:
          mongets(pmVar15,iVar19);
        }
        uVar21 = mt_random();
        if ((uVar21 & 1) != 0) {
          mongets(pmVar15,0x12);
        }
        uVar21 = mt_random();
        if (uVar21 % 3 == 2) {
          uVar21 = mt_random();
          if ((uVar21 & 1) != 0) {
            mongets(pmVar15,0xb);
LAB_001bd877:
            mongets(pmVar15,0x89);
          }
        }
        else if (uVar21 % 3 == 1) {
          mongets(pmVar15,0x25);
          uVar21 = mt_random();
          if ((uVar21 & 1) != 0) goto LAB_001bd877;
        }
        else {
          uVar21 = mt_random();
          if ((uVar21 & 3) == 0) {
            mongets(pmVar15,0x89);
          }
          uVar21 = mt_random();
          if (0x55555555 < uVar21 * -0x55555555) {
            mongets(pmVar15,0x1e);
          }
          mongets(pmVar15,0x43);
          m_initthrow(pmVar15,2,0xc);
        }
        if (iVar9 == 0x116) {
          uVar21 = mt_random();
          if ((0x55555555 < uVar21 * -0x55555555) ||
             ((in_mklev != '\0' &&
              (bVar3 = on_level(&u.uz,&dungeon_topology.d_earth_level), bVar3 != '\0')))) {
            mongets(pmVar15,0x108);
          }
          uVar21 = mt_random();
          if ((uVar21 * -0x3d70a3d7 >> 1 | (uint)((uVar21 * -0x3d70a3d7 & 1) != 0) << 0x1f) <
              0x51eb852) {
            uVar21 = 0xec;
            goto LAB_001bda18;
          }
        }
        break;
      }
      if ((ppVar17->msound == '$') ||
         (((byte)(ppVar17->msound - 0x1f) < 2 && (urole.malenum == 0x161)))) {
        poVar18 = mksobj(lev,0x39,'\0','\0');
        if (poVar18 != (obj *)0x0) {
          uVar21 = mt_random();
          poVar18->spe = (char)uVar21 + (char)(uVar21 / 3) * -3 + '\x01';
          uVar21 = mt_random();
          if ((uVar21 & 1) == 0) {
            curse(poVar18);
          }
          goto LAB_001bd53d;
        }
        break;
      }
      if (iVar9 != 0x18e) {
        if (iVar9 == 0x10c) {
          mongets(pmVar15,0x108);
          poVar18 = mksobj(lev,0xe7,'\x01','\0');
          mpickobj(pmVar15,poVar18);
          begin_burn(lev,poVar18,'\0');
        }
        break;
      }
      uVar21 = mt_random();
      if ((uVar21 & 1) != 0) break;
      iVar19 = 8;
      iVar9 = 4;
      goto LAB_001bd6b8;
    }
    switch(iVar9) {
    case 0x121:
    case 0x125:
      uVar14 = mt_random();
      uVar21 = mt_random();
      if (0x55555555 < uVar14 * -0x55555555) {
        iVar19 = 0x1d;
        iVar9 = 10;
        goto LAB_001bd9e2;
      }
      uVar14 = uVar21 >> 1;
      iVar9 = uVar21 + uVar14 / 7 + uVar14 / 7 + (uVar14 / 7) * -0x10 + 0x2b;
      uVar14 = mt_random();
      uVar21 = 0x11;
      if ((uVar14 & 1) == 0) {
        uVar21 = 0x17;
      }
      goto LAB_001bd9e7;
    case 0x122:
      uVar21 = mt_random();
      iVar19 = 0x39;
      iVar9 = 0x40;
LAB_001bd9e2:
      if ((uVar21 & 1) == 0) {
        iVar9 = iVar19;
      }
      break;
    case 0x123:
      uVar21 = mt_random();
      iVar9 = (uint)((uVar21 & 1) == 0) * 2 + 0x24;
      break;
    case 0x124:
    case 0x126:
switchD_001bd4e0_caseD_124:
      uVar21 = mt_random();
      iVar9 = (uVar21 & 1) * 3 + 0x23;
      break;
    default:
      if (iVar9 == 0x10d) goto switchD_001bd4e0_caseD_124;
      uVar14 = mt_random();
      uVar12 = mt_random();
      uVar21 = 10;
      if (0x24924924 < uVar12 * -0x49249249) {
        uVar21 = 0;
      }
      bVar24 = true;
      if ((uVar14 & 3) == 0) {
        iVar9 = 0x11;
        goto LAB_001bd9e7;
      }
      goto LAB_001bd9f7;
    }
    uVar21 = 0;
LAB_001bd9e7:
    mongets(pmVar15,iVar9);
    bVar24 = iVar9 != 0x11;
LAB_001bd9f7:
    if ((uVar21 == 0) && (bVar24)) {
      uVar21 = mt_random();
      if ((uVar21 & 3) == 0) {
        uVar21 = 0x17;
        goto LAB_001bda18;
      }
    }
    else if (uVar21 != 0) goto LAB_001bda18;
    break;
  case 0x38:
    if (iVar9 == 0x12e) {
      uVar21 = mt_random();
      iVar9 = 0x10;
      if ((uVar21 & 3) == 0) {
        iVar9 = 0x41;
      }
LAB_001bd5db:
      mongets(pmVar15,iVar9);
    }
    else if (iVar9 == 0x13a) {
      mongets(pmVar15,0x41);
      iVar9 = 0x24;
      goto LAB_001bd5db;
    }
    uVar21 = ppVar17->mflags2;
    if ((uVar21 >> 9 & 1) != 0) goto LAB_001bd5f2;
    break;
  case 0x3a:
    if (iVar9 == 0x157) {
      uVar14 = mt_random();
      uVar21 = 10;
      if (uVar14 * -0x49249249 < 0x24924925) {
        uVar21 = mt_random();
        uVar21 = (uint)(uVar21 * -0x55555555 < 0x55555556) * 8 + 0x10;
      }
      goto LAB_001bda18;
    }
    break;
  default:
    if (bVar4 != 0x25) {
      if (bVar4 != 0x29) goto switchD_001bcf9f_caseD_2f;
      uVar21 = 0xc;
      if (iVar9 == 0xd2) {
        uVar21 = 6;
      }
      uVar20 = 3;
      if (iVar9 != 0xd3) {
        uVar20 = (ulong)uVar21;
      }
      uVar21 = mt_random();
      if ((int)((ulong)uVar21 % uVar20) != 0) {
        uVar21 = 0x3c;
        goto LAB_001bda18;
      }
LAB_001bd651:
      uVar21 = 0x1c;
      goto LAB_001bda18;
    }
    uVar21 = mt_random();
    if ((uVar21 & 3) == 0) {
      m_initthrow(pmVar15,0x120,2);
    }
    uVar21 = mt_random();
    if (uVar21 * -0x55555555 < 0x55555556) {
      uVar21 = mt_random();
      uVar21 = uVar21 & 1 ^ 0x3d;
      goto LAB_001bda18;
    }
  }
switchD_001bce42_caseD_4e:
  bVar4 = pmVar15->m_lev;
  uVar21 = mt_random();
  if (uVar21 % 0x4b < (uint)bVar4) {
    iVar9 = rnd_offensive_item(pmVar15);
    mongets(pmVar15,iVar9);
  }
LAB_001bda4f:
  ppVar17 = pmVar15->data;
  lev_00 = pmVar15->dlevel;
  pdVar2 = &lev_00->z;
  bVar3 = on_level(pdVar2,&dungeon_topology.d_rogue_level);
  if (bVar3 != '\0') goto LAB_001bda7a;
  bVar4 = ppVar17->mlet;
  if (bVar4 < 0x21) {
    if (bVar4 == 8) {
      if (ppVar17 == mons + 0x143) {
        mongets(pmVar15,0xd9);
        iVar9 = 300;
LAB_001be1b9:
        mongets(pmVar15,iVar9);
        goto LAB_001be072;
      }
    }
    else if (bVar4 == 0xc) {
      xVar6 = level_difficulty(pdVar2);
      if (xVar6 == '\0') {
        iVar9 = 0;
      }
      else {
        iVar9 = (int)xVar6;
        iVar19 = iVar9;
        do {
          uVar21 = mt_random();
          iVar9 = iVar9 + uVar21 + (uVar21 / 0x1e) * -0x1f + uVar21 / 0x1e;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      poVar18 = mksobj(pmVar15->dlevel,0x1ef,'\0','\0');
      poVar18->quan = iVar9;
      add_to_minv(pmVar15,poVar18);
    }
    else if (bVar4 == 0xe) {
      uVar21 = mt_random();
      if ((uVar21 & 1) == 0) {
        mongets(pmVar15,0xeb);
      }
      uVar21 = mt_random();
      if ((uVar21 & 1) == 0) {
        iVar9 = 0x138;
        goto LAB_001be053;
      }
    }
    goto switchD_001bdb0c_caseD_23;
  }
  switch(bVar4) {
  case 0x21:
    bVar3 = In_mines(pdVar2);
    uVar21 = mt_random();
    if (uVar21 % ((uint)(bVar3 == '\0') * 5 + 5) == 0) {
      uVar21 = mt_random();
      iVar9 = ((uVar21 & 3) == 0) + 0xe5;
LAB_001be053:
      mongets(pmVar15,iVar9);
    }
    break;
  case 0x22:
    if (ppVar17 != mons + 0xb6) {
      if ((ppVar17->mflags2 & 0x4000) != 0) {
        bVar4 = pmVar15->m_lev;
        uVar21 = mt_random();
        uVar20 = (ulong)uVar21 % (ulong)(bVar4 >> 1);
        uVar21 = (uint)uVar20;
        while (uVar21 != 0) {
          iVar9 = rnd_class(0x1f0,0x20e);
          poVar18 = mksobj(lev_00,iVar9,'\0','\0');
          uVar21 = mt_random();
          poVar18->quan = (uVar21 & 1) + 3;
          uVar21 = weight(poVar18);
          poVar18->owt = uVar21;
          mpickobj(pmVar15,poVar18);
          uVar21 = (int)uVar20 - 1;
          uVar20 = (ulong)uVar21;
        }
      }
      break;
    }
    uVar21 = mt_random();
    if ((0x55555555 < uVar21 * -0x55555555) &&
       ((in_mklev == '\0' ||
        (bVar3 = on_level(pdVar2,&dungeon_topology.d_earth_level), bVar3 == '\0'))))
    goto LAB_001be072;
    iVar9 = 0x1cf;
    goto LAB_001be4e5;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 0x26:
    if (ppVar17 == mons + 0xbf) {
      uVar21 = mt_random();
      if (uVar21 * -0x3b13b13b < 0x13b13b14) {
        uVar21 = mt_random();
        iVar9 = 0x15;
        if (uVar21 * -0x49249249 < 0x24924925) {
          iVar9 = 0x1c3;
        }
        goto LAB_001be4e5;
      }
    }
    else {
      if (ppVar17 != mons + 0xc0) break;
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        uVar21 = mt_random();
        iVar9 = 0x15;
        if (uVar21 * -0x55555555 < 0x55555556) {
          iVar9 = 0x3e;
        }
        uVar21 = mt_random();
        poVar18 = mksobj(lev_00,iVar9,'\x01',uVar21 * -0x3b13b13b < 0x13b13b14);
        if (poVar18->spe < '\x02') {
          uVar21 = mt_random();
          poVar18->spe = (char)uVar21 + (char)(uVar21 / 3) * -3 + '\x01';
        }
        uVar21 = mt_random();
        if ((uVar21 & 3) == 0) {
          poVar18->field_0x4b = poVar18->field_0x4b | 0x10;
        }
        mpickobj(pmVar15,poVar18);
      }
    }
    goto LAB_001be072;
  case 0x27:
    uVar21 = mt_random();
    if (0x24924924 < uVar21 * -0x49249249) {
      iVar9 = 0x7c;
      goto LAB_001be053;
    }
    break;
  case 0x2b:
    uVar21 = mt_random();
    if ((uVar21 * -0x33333333 >> 2 | uVar21 * 0x40000000) < 0xccccccd) {
      poVar18 = mksobj(lev_00,0xda,'\0','\0');
      poVar18->spe = '\x01';
      uVar21 = weight(poVar18);
      poVar18->owt = uVar21;
      mpickobj(pmVar15,poVar18);
    }
    break;
  case 0x30:
    uVar21 = mt_random();
    if ((uVar21 & 1) != 0) {
      bVar4 = pmVar15->m_lev;
      uVar21 = mt_random();
      if (uVar21 / 0x1e + uVar21 / 0x1e + (uVar21 / 0x1e) * -0x20 + uVar21 < (uint)bVar4) {
        iVar9 = 0x151;
      }
      else {
        iVar9 = 0x150;
      }
      goto LAB_001be053;
    }
    break;
  case 0x31:
    if (ppVar17 != mons + 0xed) break;
    poVar18 = mksobj(lev_00,0xb9,'\0','\0');
    curse(poVar18);
    mpickobj(pmVar15,poVar18);
    goto LAB_001be072;
  default:
    if (bVar4 == 0x38) {
      if (ppVar17 == mons + 0x137) {
        uVar21 = mt_random();
        if ((uVar21 & 3) == 0) {
          iVar9 = 10;
          goto LAB_001be4e5;
        }
        goto LAB_001be072;
      }
      break;
    }
    if (bVar4 != 0x35) break;
    if ((ppVar17->mflags2 & 0x400) == 0) {
      if (ppVar17 == mons + 0x11a) {
        mongets(pmVar15,0xe2);
        uVar21 = mt_random();
        switch(uVar21 & 3) {
        case 0:
          mongets(pmVar15,0x1d0);
        case 1:
          mongets(pmVar15,0x136);
        case 2:
          mongets(pmVar15,0x131);
        case 3:
          iVar9 = 0x1c4;
        }
        goto LAB_001be1b9;
      }
      if ((ppVar17->msound == '$') ||
         (bVar4 = ppVar17->msound - 0x1f, bVar4 < 2 && urole.malenum == 0x161)) {
        uVar21 = mt_random();
        iVar9 = 0x81;
        if (uVar21 * -0x49249249 < 0x24924925) {
          uVar21 = mt_random();
          iVar9 = (uint)(uVar21 * -0x55555555 < 0x55555556) * 2 + 0x84;
        }
        mongets(pmVar15,iVar9);
        mongets(pmVar15,0x88);
        uVar21 = mt_random();
        mkmonmoney(pmVar15,(ulong)(uVar21 % 10 + 0x14));
      }
      else if (urole.malenum == 0x160 && bVar4 < 2) {
        uVar21 = mt_random();
        iVar9 = (uint)(uVar21 * -0x45d1745d < 0x1745d175) * 5 + 0x81;
        goto LAB_001be053;
      }
      break;
    }
    iVar9 = monsndx(ppVar17);
    iVar19 = -2;
    switch(iVar9) {
    case 0x11c:
      iVar19 = -1;
      break;
    case 0x121:
    case 0x125:
      iVar19 = 3;
      goto LAB_001be296;
    case 0x122:
      iVar19 = 0;
      break;
    case 0x123:
    case 0x126:
      goto switchD_001bdf93_caseD_123;
    case 0x124:
      iVar19 = -3;
switchD_001bdf93_caseD_123:
      uVar21 = mt_random();
      if (uVar21 * -0x33333333 < 0x33333334) break;
      uVar21 = mt_random();
      iVar9 = (uVar21 * -0x33333333 < 0x33333334) + 0x6a;
      iVar10 = 7;
      goto LAB_001be2d3;
    default:
      if (iVar9 == 0x10d) goto switchD_001bdf93_caseD_123;
    case 0x11d:
    case 0x11e:
    case 0x11f:
    case 0x120:
      monsndx(ppVar17);
      iVar19 = 0;
      warning("odd mercenary %d?");
    }
    uVar21 = mt_random();
    if (uVar21 * -0x33333333 < 0x33333334) {
LAB_001be296:
      uVar21 = mt_random();
      if (uVar21 * -0x33333333 < 0x33333334) {
        iVar10 = 2;
        iVar9 = 0x77;
      }
      else {
        uVar21 = mt_random();
        iVar9 = 0x75 - (uint)(uVar21 * -0x55555555 < 0x55555556);
        iVar10 = 3;
      }
    }
    else {
      uVar21 = mt_random();
      iVar9 = (uVar21 * -0x55555555 < 0x55555556) + 0x6d;
      iVar10 = 6;
    }
LAB_001be2d3:
    iVar9 = mongets(pmVar15,iVar9);
    iVar9 = iVar9 + iVar10 + iVar19;
    if (iVar9 < 10) {
      uVar21 = mt_random();
      iVar19 = 0x50;
      if (uVar21 * -0x55555555 < 0x55555556) {
        uVar21 = mt_random();
        iVar19 = 0x4e;
        if ((uVar21 & 1) != 0) goto LAB_001be311;
      }
      else {
LAB_001be311:
        iVar19 = mongets(pmVar15,iVar19);
        iVar9 = iVar9 + iVar19 + 1;
        if (9 < iVar9) goto LAB_001be3df;
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        uVar21 = mt_random();
        if ((uVar21 & 1) != 0) {
          iVar10 = 2;
          iVar19 = 0x8c;
          goto LAB_001be359;
        }
      }
      else {
        iVar10 = 1;
        iVar19 = 0x88;
LAB_001be359:
        iVar19 = mongets(pmVar15,iVar19);
        iVar9 = iVar19 + iVar10 + iVar9;
        if (9 < iVar9) goto LAB_001be3df;
      }
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        uVar21 = mt_random();
        if ((uVar21 & 1) != 0) {
          iVar10 = 2;
          iVar19 = 0x95;
          goto LAB_001be3a0;
        }
      }
      else {
        iVar10 = 1;
        iVar19 = 0x93;
LAB_001be3a0:
        iVar19 = mongets(pmVar15,iVar19);
        if (9 < iVar19 + iVar10 + iVar9) goto LAB_001be3df;
      }
      uVar21 = mt_random();
      iVar9 = 0x8f;
      if (uVar21 * -0x55555555 < 0x55555556) {
        uVar21 = mt_random();
        iVar9 = 0x83;
        if ((uVar21 & 1) == 0) goto LAB_001be3df;
      }
      mongets(pmVar15,iVar9);
    }
LAB_001be3df:
    if ((ppVar17 == mons + 0x126 || ppVar17 == mons + 0x125) ||
        (ppVar17 == mons + 0x10d || ppVar17 == mons + 0x11c)) {
      if (ppVar17 != mons + 0x125) break;
      uVar21 = mt_random();
      if (0x55555555 < uVar21 * -0x55555555) {
        iVar9 = 0xfa;
        goto LAB_001be4e5;
      }
      goto LAB_001be072;
    }
    uVar21 = mt_random();
    if (uVar21 * -0x55555555 < 0x55555556) {
      mongets(pmVar15,0x127);
    }
    uVar21 = mt_random();
    if ((uVar21 & 1) == 0) {
      mongets(pmVar15,0x128);
    }
    if (ppVar17 != mons + 0x121) {
      uVar21 = mt_random();
      if (uVar21 * -0x55555555 < 0x55555556) {
        iVar9 = 0x105;
LAB_001be4e5:
        mongets(pmVar15,iVar9);
      }
      goto LAB_001be072;
    }
    goto LAB_001be492;
  }
switchD_001bdb0c_caseD_23:
  if (ppVar17 == mons + 0x121) {
LAB_001be492:
    uVar21 = mt_random();
    if (uVar21 * -0x3b13b13b < 0x13b13b14) goto LAB_001be072;
  }
  else {
LAB_001be072:
    bVar4 = pmVar15->m_lev;
    uVar21 = mt_random();
    if (uVar21 % 0x32 < (uint)bVar4) {
      iVar9 = rnd_defensive_item(pmVar15);
      mongets(pmVar15,iVar9);
    }
    bVar4 = pmVar15->m_lev;
    uVar21 = mt_random();
    if (uVar21 % 100 < (uint)bVar4) {
      iVar9 = rnd_misc_item(pmVar15);
      mongets(pmVar15,iVar9);
    }
    if ((((ppVar17->mflags2 & 0x10000000) != 0) &&
        (poVar18 = findgold(pmVar15->minvent), poVar18 == (obj *)0x0)) &&
       (uVar21 = mt_random(), uVar21 * -0x33333333 < 0x33333334)) {
      xVar6 = level_difficulty(pdVar2);
      poVar18 = pmVar15->minvent;
      if (xVar6 == '\0') {
        iVar9 = 0;
      }
      else {
        iVar9 = (int)xVar6;
        iVar19 = iVar9;
        do {
          uVar21 = mt_random();
          iVar9 = iVar9 + uVar21 % ((uint)(poVar18 == (obj *)0x0) * 5 + 5);
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      poVar18 = mksobj(pmVar15->dlevel,0x1ef,'\0','\0');
      poVar18->quan = iVar9;
      add_to_minv(pmVar15,poVar18);
    }
  }
LAB_001bda7a:
  m_dowear(lev,pmVar15,'\x01');
LAB_001bda93:
  if (((mmflags & 2U) == 0) && (uVar8 = local_e8->mflags3, (uVar8 & 0xc0) != 0)) {
    if ((uVar8 & 0x40) != 0) {
      pbVar1 = (byte *)((long)&pmVar15->mstrategy + 3);
      *pbVar1 = *pbVar1 | 0x20;
    }
    if ((char)uVar8 < '\0') {
      pbVar1 = (byte *)((long)&pmVar15->mstrategy + 3);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  if (in_mklev == '\0') {
    newsym((int)pmVar15->mx,(int)pmVar15->my);
  }
  return pmVar15;
}

Assistant:

struct monst *makemon(const struct permonst *ptr,
		      struct level *lev, int x, int y, int mmflags)
{
	struct monst *mtmp;
	int mndx, mcham, ct, mitem, xtyp;
	boolean anymon = (!ptr);
	boolean byyou = (x == u.ux && y == u.uy);
	boolean allow_minvent = ((mmflags & NO_MINVENT) == 0);
	boolean countbirth = ((mmflags & MM_NOCOUNTBIRTH) == 0);
	boolean randpos_success = TRUE;	/* in case we aren't randomly positioning */
	unsigned gpflags = (mmflags & MM_IGNOREWATER) ? MM_IGNOREWATER : 0;

	/* if caller wants random location, do it here */
	if (x == 0 && y == 0) {
		int tryct = 0;	/* careful with bigrooms */
		struct monst fakemon;

		fakemon.data = ptr;	/* set up for goodpos */
		do {
			x = rn1(COLNO - 3, 2);
			y = rn2(ROWNO);
			tryct++;
		} while ((!goodpos(lev, x, y, ptr ? &fakemon : NULL, gpflags) &&
			  tryct <= 100) ||
			 (!in_mklev && tryct <= 50 && cansee(x, y)));
		randpos_success = tryct < 100;
	} else if (byyou && !in_mklev) {
		coord bypos;

		if (enexto_core(&bypos, lev, u.ux, u.uy, ptr, gpflags)) {
			x = bypos.x;
			y = bypos.y;
		} else
			return NULL;
	}

	/* Use adjacent position if chosen place is occupied, or
	 * random positioning was asked for but failed. */
	if (MON_AT(lev, x, y) || !randpos_success) {
		if ((mmflags & MM_ADJACENTOK) != 0) {
			coord bypos;
			if (enexto_core(&bypos, lev, x, y, ptr, gpflags)) {
				x = bypos.x;
				y = bypos.y;
			} else
				return NULL;
		} else 
			return NULL;
	}

	if (ptr){
		mndx = monsndx(ptr);
		/* if you are to make a specific monster and it has
		   already been genocided, return */
		if (mvitals[mndx].mvflags & G_GENOD)
		    return NULL;
	} else {
		/* make a random (common) monster that can survive here.
		 * (the special levels ask for random monsters at specific
		 * positions, causing mass drowning on the medusa level,
		 * for instance.)
		 */
		int tryct = 0;	/* maybe there are no good choices */
		struct monst fakemon;
		do {
			if (!(ptr = rndmonst(lev))) {
			    return NULL;	/* no more monsters! */
			}
			fakemon.data = ptr;	/* set up for goodpos */
		} while (!goodpos(lev, x, y, &fakemon, gpflags) && tryct++ < 50);
		mndx = monsndx(ptr);
	}
	
	if (mndx == quest_info(MS_LEADER))
	    ptr = &pm_leader;
	else if (mndx == quest_info(MS_GUARDIAN))
	    ptr = &pm_guardian;
	else if (mndx == quest_info(MS_NEMESIS))
	    ptr = &pm_nemesis;
	
	propagate(mndx, countbirth, FALSE);

	xtyp = ptr->pxtyp;
	if (mmflags & MM_EDOG)
	    xtyp = MX_EDOG;
	else if (mmflags & MM_EMIN)
	    xtyp = MX_EMIN;
	
	mtmp = newmonst(xtyp, 0);
	mtmp->nmon = lev->monlist;
	lev->monlist = mtmp;
	mtmp->m_id = flags.ident++;
	if (!mtmp->m_id)
	    mtmp->m_id = flags.ident++;	/* ident overflowed */
	set_mon_data(mtmp, ptr, 0);
	
	if (mtmp->data->msound == MS_LEADER)
	    quest_status.leader_m_id = mtmp->m_id;
	mtmp->mnum = mndx;

	mtmp->m_lev = adj_lev(&lev->z, ptr);
	if (is_golem(ptr)) {
	    mtmp->mhpmax = mtmp->mhp = golemhp(mndx);
	} else if (is_rider(ptr)) {
	    /* We want low HP, but a high mlevel so they can attack well
	     *
	     * DSR 10/31/09: What, are you nuts?  They're way too crunchy. */
	    mtmp->mhpmax = mtmp->mhp = 100 + dice(8,8);
	} else if (ptr->mlevel > 49) {
	    /* "special" fixed hp monster
	     * the hit points are encoded in the mlevel in a somewhat strange
	     * way to fit in the 50..127 positive range of a signed character
	     * above the 1..49 that indicate "normal" monster levels */
	    mtmp->mhpmax = mtmp->mhp = 2*(ptr->mlevel - 6);
	    mtmp->m_lev = mtmp->mhp / 4;	/* approximation */
	} else if (ptr->mlet == S_DRAGON && mndx >= PM_GRAY_DRAGON &&
		   In_endgame(&lev->z)) {
	    /* dragons in the endgame are always at least average HP
	     * note modified hit die here as well; they're MZ_GIGANTIC */
	    mtmp->mhpmax = mtmp->mhp = 7 * mtmp->m_lev + dice((int)mtmp->m_lev, 8);
	} else if (!mtmp->m_lev) {
	    mtmp->mhpmax = mtmp->mhp = rnd(4);	/* level 0 monsters are pathetic */
	} else if (ptr->msound == MS_LEADER) {
	    /* Quest Leaders need to be fairly burly */
	    mtmp->mhpmax = mtmp->mhp = 135 + rnd(30);
	} else {
	    /* plain old ordinary monsters; modify hit die based on size;
	     * big-ass critters like mastodons should have big-ass HP, and
	     * small things like bees and locusts should get less */
	    int mhitdie;
	    switch (mtmp->data->msize) {
		case MZ_TINY: mhitdie = 4; break;
		case MZ_SMALL: mhitdie = 6; break;
		case MZ_LARGE: mhitdie = 10; break;
		case MZ_HUGE: mhitdie = 12; break;
		case MZ_GIGANTIC: mhitdie = 15; break;
		case MZ_MEDIUM:
		default:
		    mhitdie = 8;
		    break;
	    }
	    mtmp->mhpmax = mtmp->mhp = dice((int)mtmp->m_lev, mhitdie);
	    if (is_home_elemental(&lev->z, ptr))
		mtmp->mhpmax = (mtmp->mhp *= 3);
	}

	if (is_female(ptr)) mtmp->female = TRUE;
	else if (is_male(ptr)) mtmp->female = FALSE;
	else mtmp->female = rn2(2);	/* ignored for neuters */

	if (In_sokoban(&lev->z) && !mindless(ptr))  /* know about traps here */
	    mtmp->mtrapseen = (1L << (PIT - 1)) | (1L << (HOLE - 1));
	if (ptr->msound == MS_LEADER)		/* leader knows about portal */
	    mtmp->mtrapseen |= (1L << (MAGIC_PORTAL-1));

	mtmp->dlevel = lev;
	place_monster(mtmp, x, y);
	mtmp->mcansee = mtmp->mcanmove = TRUE;
	mtmp->mpeaceful = (mmflags & MM_ANGRY) ? FALSE : peace_minded(ptr);

	switch(ptr->mlet) {
		case S_MIMIC:
			set_mimic_sym(mtmp, lev);
			break;
		case S_SPIDER:
		case S_SNAKE:
			if (in_mklev)
			    if (x && y)
				mkobj_at(0, lev, x, y, TRUE);
			if (hides_under(ptr) && OBJ_AT_LEV(lev, x, y))
			    mtmp->mundetected = TRUE;
			break;
		case S_LIGHT:
		case S_ELEMENTAL:
			if (mndx == PM_STALKER || mndx == PM_BLACK_LIGHT) {
			    mtmp->perminvis = TRUE;
			    mtmp->minvis = TRUE;
			}
			break;
		case S_LEPRECHAUN:
			mtmp->msleeping = 1;
			break;
		case S_JABBERWOCK:
			if (rn2(5) && !u.uhave.amulet) mtmp->msleeping = 1;
			break;
		case S_NYMPH:
			if (!u.uhave.amulet) mtmp->msleeping = 1;
			break;
		case S_ORC:
			if (Race_if (PM_ELF)) mtmp->mpeaceful = FALSE;
			break;
		case S_UNICORN:
			if (is_unicorn(ptr) &&
					sgn(u.ualign.type) == sgn(ptr->maligntyp))
				mtmp->mpeaceful = TRUE;
			break;
		case S_BAT:
			if (In_hell(&lev->z) && is_bat(ptr))
			    mon_adjust_speed(mtmp, 2, NULL);
			break;
	}
	if ((ct = emits_light(mtmp->data)) > 0)
		new_light_source(lev, mtmp->mx, mtmp->my, ct,
				 LS_MONSTER, mtmp);
	mitem = 0;	/* extra inventory item for this monster */

	if ((mcham = pm_to_cham(mndx)) != CHAM_ORDINARY) {
		/* If you're protected with a ring, don't create
		 * any shape-changing chameleons -dgk
		 */
		if (Protection_from_shape_changers)
			mtmp->cham = CHAM_ORDINARY;
		else {
			mtmp->cham = mcham;
			newcham(lev, mtmp, rndmonst(lev), FALSE, FALSE);
		}
	} else if (mndx == PM_WIZARD_OF_YENDOR) {
		mtmp->iswiz = TRUE;
		flags.no_of_wizards++;
		if (flags.no_of_wizards == 1 && Is_earthlevel(&lev->z))
			mitem = SPE_DIG;
	} else if (mndx == PM_DJINNI) {
		flags.djinni_count++;
	} else if (mndx == PM_GHOST) {
		flags.ghost_count++;
		if (!(mmflags & MM_NONAME))
			mtmp = christen_monst(mtmp, rndghostname());
	}
	if (mitem && allow_minvent) mongets(mtmp, mitem);

	if (in_mklev) {
		if (((is_ndemon(ptr)) ||
		    (mndx == PM_WUMPUS) ||
		    (mndx == PM_LONG_WORM) ||
		    (mndx == PM_GIANT_EEL)) && !u.uhave.amulet && rn2(5))
			mtmp->msleeping = TRUE;
	} else {
		if (byyou) {
			newsym(mtmp->mx,mtmp->my);
			set_apparxy(lev, mtmp);
		}
	}
	if (is_dprince(ptr) && ptr->msound == MS_BRIBE) {
	    mtmp->mpeaceful = mtmp->minvis = mtmp->perminvis = 1;
	    mtmp->mavenge = 0;
	    if (uwep && uwep->oartifact == ART_EXCALIBUR)
		mtmp->mpeaceful = mtmp->mtame = FALSE;
	}
	if (mndx == PM_LONG_WORM && (mtmp->wormno = get_wormno(lev)) != 0)
	{
	    /* we can now create worms with tails - 11/91 */
	    initworm(mtmp, rn2(5));
	    if (count_wsegs(mtmp)) place_worm_tail_randomly(mtmp, x, y);
	}
	set_malign(mtmp);		/* having finished peaceful changes */
	if (anymon) {
	    if ((ptr->geno & G_SGROUP) && rn2(2)) {
		m_initsgrp(mtmp, lev, mtmp->mx, mtmp->my);
	    } else if (ptr->geno & G_LGROUP) {
		if (rn2(3))  m_initlgrp(mtmp, lev, mtmp->mx, mtmp->my);
		else	    m_initsgrp(mtmp, lev, mtmp->mx, mtmp->my);
	    }
	}

	if (allow_minvent) {
	    if (is_armed(ptr))
		m_initweap(lev, mtmp);	/* equip with weapons / armor */
	    m_initinv(mtmp);  /* add on a few special items incl. more armor */
	    m_dowear(lev, mtmp, TRUE);
	} else {
	    /* no initial inventory is allowed */
	    if (mtmp->minvent) discard_minvent(mtmp);
	    mtmp->minvent = NULL;    /* caller expects this */
	}
	if ((ptr->mflags3 & M3_WAITMASK) && !(mmflags & MM_NOWAIT)) {
		if (ptr->mflags3 & M3_WAITFORU)
			mtmp->mstrategy |= STRAT_WAITFORU;
		if (ptr->mflags3 & M3_CLOSE)
			mtmp->mstrategy |= STRAT_CLOSE;
	}

	if (!in_mklev)
	    newsym(mtmp->mx,mtmp->my);	/* make sure the mon shows up */

	return mtmp;
}